

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O0

int dsdKernelFindCommonComponents
              (Dsd_Manager_t *pDsdMan,Dsd_Node_t *pL,Dsd_Node_t *pH,Dsd_Node_t ***pCommon,
              Dsd_Node_t **pLastDiffL,Dsd_Node_t **pLastDiffH)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  int local_6c;
  int local_68;
  int iCurH;
  int iCurL;
  int TopVar;
  DdNode *bSHcur;
  DdNode *bSLcur;
  Dsd_Node_t *pHcur;
  Dsd_Node_t *pLcur;
  int nCommon;
  Dsd_Node_t **pLastDiffH_local;
  Dsd_Node_t **pLastDiffL_local;
  Dsd_Node_t ***pCommon_local;
  Dsd_Node_t *pH_local;
  Dsd_Node_t *pL_local;
  Dsd_Manager_t *pDsdMan_local;
  
  pLcur._4_4_ = 0;
  local_68 = 0;
  local_6c = 0;
  while( true ) {
    bVar3 = false;
    if (local_68 < pL->nDecs) {
      bVar3 = local_6c < pH->nDecs;
    }
    if (!bVar3) break;
    puVar1 = *(uint **)(((ulong)pL->pDecs[local_68] & 0xfffffffffffffffe) + 0x10);
    puVar2 = *(uint **)(((ulong)pH->pDecs[local_6c] & 0xfffffffffffffffe) + 0x10);
    if (pDsdMan->dd->perm[*puVar1] < pDsdMan->dd->perm[*puVar2]) {
      iCurH = *puVar1;
    }
    else {
      iCurH = *puVar2;
    }
    if ((iCurH == *puVar1) && (iCurH == *puVar2)) {
      if (pL->pDecs[local_68] == pH->pDecs[local_6c]) {
        dsdKernelFindCommonComponents::Common[pLcur._4_4_] = pL->pDecs[local_68];
        pLcur._4_4_ = pLcur._4_4_ + 1;
      }
      else {
        *pLastDiffL = pL->pDecs[local_68];
        *pLastDiffH = pH->pDecs[local_6c];
      }
      local_6c = local_6c + 1;
      local_68 = local_68 + 1;
    }
    else if (iCurH == *puVar1) {
      *pLastDiffL = pL->pDecs[local_68];
      local_68 = local_68 + 1;
    }
    else {
      *pLastDiffH = pH->pDecs[local_6c];
      local_6c = local_6c + 1;
    }
  }
  if (local_68 < pL->nDecs) {
    *pLastDiffL = pL->pDecs[local_68];
  }
  if (local_6c < pH->nDecs) {
    *pLastDiffH = pH->pDecs[local_6c];
  }
  *pCommon = dsdKernelFindCommonComponents::Common;
  return pLcur._4_4_;
}

Assistant:

int dsdKernelFindCommonComponents( Dsd_Manager_t * pDsdMan, Dsd_Node_t * pL, Dsd_Node_t * pH, Dsd_Node_t *** pCommon, Dsd_Node_t ** pLastDiffL, Dsd_Node_t ** pLastDiffH )
{
    static Dsd_Node_t * Common[MAXINPUTS];
    int nCommon = 0;

    // pointers to the current decomposition entries
    Dsd_Node_t * pLcur;
    Dsd_Node_t * pHcur;

    // the pointers to their supports
    DdNode * bSLcur;
    DdNode * bSHcur;

    // the top variable in the supports
    int TopVar;

    // the indices running through the components
    int iCurL = 0;
    int iCurH = 0;
    while ( iCurL < pL->nDecs && iCurH < pH->nDecs )
    { // both did not run out

        pLcur = Dsd_Regular(pL->pDecs[iCurL]);
        pHcur = Dsd_Regular(pH->pDecs[iCurH]);

        bSLcur = pLcur->S;
        bSHcur = pHcur->S;

        // find out what component is higher in the BDD
        if ( pDsdMan->dd->perm[bSLcur->index] < pDsdMan->dd->perm[bSHcur->index] )
            TopVar = bSLcur->index;
        else
            TopVar = bSHcur->index;

        if ( TopVar == bSLcur->index && TopVar == bSHcur->index ) 
        {
            // the components may be equal - should match exactly!
            if ( pL->pDecs[iCurL] == pH->pDecs[iCurH] )
                Common[nCommon++] = pL->pDecs[iCurL];
            else
            {
                *pLastDiffL = pL->pDecs[iCurL];
                *pLastDiffH = pH->pDecs[iCurH];
            }

            // skip both
            iCurL++;
            iCurH++;
        }
        else if ( TopVar == bSLcur->index )
        {  // the components cannot be equal
            // skip the top-most one
            *pLastDiffL = pL->pDecs[iCurL++];
        }
        else // if ( TopVar == bSHcur->index )
        {  // the components cannot be equal
            // skip the top-most one
            *pLastDiffH = pH->pDecs[iCurH++];
        }
    }

    // if one of the lists still has components, write the first one down
    if ( iCurL < pL->nDecs )
        *pLastDiffL = pL->pDecs[iCurL];

    if ( iCurH < pH->nDecs )
        *pLastDiffH = pH->pDecs[iCurH];

    // return the pointer to the array
    *pCommon = Common;
    // return the number of common components
    return nCommon;         
}